

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save-charoutput.c
# Opt level: O2

_Bool save_charoutput(void)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  ang_file *f;
  char path [1024];
  
  path_build(path,0x400,ANGBAND_DIR_USER,"CharOutput.txt");
  _Var1 = false;
  f = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (f != (ang_file *)0x0) {
    _Var1 = file_put(f,"{\n");
    _Var2 = file_putf(f,"race: \"%s\",\n",player->race->name);
    _Var3 = file_putf(f,"class: \"%s\",\n",player->class->name);
    _Var4 = file_put(f,"mapName: \"Angband\",\n");
    _Var5 = file_putf(f,"dLvl: \"%i\",\n",(ulong)(uint)(int)player->depth);
    _Var6 = file_putf(f,"cLvl: \"%i\",\n",(ulong)(uint)(int)player->lev);
    _Var7 = file_putf(f,"isDead: \"%i\",\n",(ulong)player->is_dead);
    _Var8 = file_putf(f,"killedBy: \"%s\"\n",player->died_from);
    _Var9 = file_put(f,"}");
    _Var10 = file_close(f);
    _Var1 = (_Var2 && _Var1) &&
            ((((_Var6 && _Var5) && (((_Var10 && _Var9) && _Var8) && _Var7)) && _Var4) && _Var3);
  }
  return _Var1;
}

Assistant:

bool save_charoutput(void)
{
	char path[1024];
	ang_file *fo;
	bool written = true;

	path_build(path, sizeof(path), ANGBAND_DIR_USER, "CharOutput.txt");
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		if (! file_put(fo, "{\n")) written = false;
		if (! file_putf(fo, "race: \"%s\",\n", player->race->name)) written = false;
		if (! file_putf(fo, "class: \"%s\",\n", player->class->name)) written = false;
		if (! file_put(fo, "mapName: \"Angband\",\n")) written = false;
		if (! file_putf(fo, "dLvl: \"%i\",\n", player->depth)) written = false;
		if (! file_putf(fo, "cLvl: \"%i\",\n", player->lev)) written = false;
		if (! file_putf(fo, "isDead: \"%i\",\n", (player->is_dead) ? 1 : 0)) written = false;
		if (! file_putf(fo, "killedBy: \"%s\"\n", player->died_from)) written = false;
		if (! file_put(fo, "}")) written = false;
		if (! file_close(fo)) written = false;
	} else {
		written = false;
	}
	return written;
}